

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int_t * intCalloc(int_t n)

{
  int_t *piVar1;
  char local_128 [8];
  char msg [256];
  int local_1c;
  int_t i;
  int_t *buf;
  int_t n_local;
  
  piVar1 = (int_t *)superlu_malloc((long)n << 2);
  if (piVar1 == (int_t *)0x0) {
    sprintf(local_128,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in intCalloc()",
            0xb9,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/memory.c"
           );
    superlu_abort_and_exit(local_128);
  }
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    piVar1[local_1c] = 0;
  }
  return piVar1;
}

Assistant:

int_t *intCalloc(int_t n)
{
    int_t *buf;
    register int_t i;
    buf = (int_t *) SUPERLU_MALLOC(n * sizeof(int_t));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC fails for buf in intCalloc()");
    }
    for (i = 0; i < n; ++i) buf[i] = 0;
    return (buf);
}